

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshTopology::TopEdgeIsHidden(ON_MeshTopology *this,int topei)

{
  int iVar1;
  ON_MeshTopologyEdge *pOVar2;
  ON_MeshTopologyVertex *pOVar3;
  ON_MeshTopologyVertex *pOVar4;
  bool *local_58;
  int local_44;
  int i;
  ON_MeshTopologyVertex *topv1;
  ON_MeshTopologyVertex *topv0;
  ON_MeshTopologyEdge *tope;
  bool *bHiddenVertex;
  int topei_local;
  ON_MeshTopology *this_local;
  
  if (this->m_mesh == (ON_Mesh *)0x0) {
    local_58 = (bool *)0x0;
  }
  else {
    local_58 = ON_Mesh::HiddenVertexArray(this->m_mesh);
  }
  if (((local_58 == (bool *)0x0) || (topei < 0)) ||
     (iVar1 = ON_SimpleArray<ON_MeshTopologyEdge>::Count(&this->m_tope), iVar1 <= topei)) {
    this_local._7_1_ = false;
  }
  else {
    pOVar2 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[](&this->m_tope,topei);
    pOVar3 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&this->m_topv,pOVar2->m_topvi[0]);
    pOVar4 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&this->m_topv,pOVar2->m_topvi[1]);
    local_44 = 0;
    while ((local_44 < pOVar3->m_v_count && ((local_58[pOVar3->m_vi[local_44]] & 1U) != 0))) {
      local_44 = local_44 + 1;
    }
    if (local_44 < pOVar3->m_v_count) {
      for (local_44 = 0; local_44 < pOVar4->m_v_count; local_44 = local_44 + 1) {
        if ((local_58[pOVar4->m_vi[local_44]] & 1U) == 0) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_MeshTopology::TopEdgeIsHidden( int topei ) const
{
  // ugly - but faster than calling TopVertexIsHidden()
  const bool* bHiddenVertex = m_mesh ? m_mesh->HiddenVertexArray() : 0;
  if ( bHiddenVertex && topei >= 0 && topei < m_tope.Count()  )
  {
    const ON_MeshTopologyEdge& tope = m_tope[topei];
    const ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
    const ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
    int i;

    for ( i = 0; i < topv0.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv0.m_vi[i]] )
        break;
    }
    if ( i >= topv0.m_v_count )
      return true;

    for ( i = 0; i < topv1.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv1.m_vi[i]] )
        return false;
    }

    return true;
  }
  return false;
}